

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  char *pcVar5;
  long lVar6;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Starting Plugin Manager...");
  std::endl<char,std::char_traits<char>>(poVar3);
  for (lVar6 = 0; lVar6 != 0x18; lVar6 = lVar6 + 8) {
    pcVar1 = *(char **)((long)&PTR_anon_var_dwarf_6e8_00103d50 + lVar6);
    poVar3 = std::operator<<((ostream *)&std::cout,"========= ");
    poVar3 = std::operator<<(poVar3,pcVar1);
    poVar3 = std::operator<<(poVar3," =========");
    std::endl<char,std::char_traits<char>>(poVar3);
    plVar4 = (long *)IPluginManager::Get();
    plVar4 = (long *)(**(code **)(*plVar4 + 0x10))(plVar4,pcVar1);
    if (plVar4 != (long *)0x0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Plugin name: ");
      pcVar5 = (char *)(**(code **)(*plVar4 + 0x10))(plVar4);
      poVar3 = std::operator<<(poVar3,pcVar5);
      std::endl<char,std::char_traits<char>>(poVar3);
      plVar4 = (long *)__dynamic_cast(plVar4,&IPlugin::typeinfo,&ICustomPlugin::typeinfo,0);
      if (plVar4 == (long *)0x0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Plugin does not implement ICustomPlugin.");
      }
      else {
        (**(code **)(*plVar4 + 0x18))(plVar4,"Agustin");
        poVar3 = std::operator<<((ostream *)&std::cout,"Plugin->doSomething(4, 5) = ");
        iVar2 = (**(code **)(*plVar4 + 0x20))(plVar4,4,5);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      }
      std::endl<char,std::char_traits<char>>(poVar3);
      plVar4 = (long *)IPluginManager::Get();
      (**(code **)(*plVar4 + 0x18))(plVar4,pcVar1);
    }
  }
  std::istream::get();
  return 0;
}

Assistant:

int main()
{
	const char* plugins[] = { "pluginA", "pluginB", "pluginC" };

	std::cout << "Starting Plugin Manager..." << std::endl;
	for ( const auto pluginFilename : plugins )
	{
		std::cout << "========= " << pluginFilename << " =========" << std::endl;
		if ( IPlugin* plugin = IPluginManager::Get()->loadPlugin( pluginFilename ) )
		{
			std::cout << "Plugin name: " << plugin->name() << std::endl;
			if ( ICustomPlugin* customPlugin = dynamic_cast<ICustomPlugin*>( plugin ) )
			{
				customPlugin->sayHelloTo( "Agustin" );
				std::cout << "Plugin->doSomething(4, 5) = " << customPlugin->doSomething( 4, 5 ) << std::endl;
			}
			else
			{
				std::cout << "Plugin does not implement ICustomPlugin." << std::endl;
			}
			IPluginManager::Get()->unloadPlugin( pluginFilename );
		}
	}

	std::cin.get();
	return 0;
}